

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

btree_result btree_prev(btree_iterator *it,void *key_buf,void *value_buf)

{
  btree_result bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar1 = _btree_prev(it,key_buf,value_buf,(it->btree).height - 1);
  bVar2 = it->flags & 0xfc;
  bVar3 = bVar2 + 2;
  if (bVar1 != BTREE_RESULT_SUCCESS) {
    bVar3 = bVar2;
  }
  it->flags = bVar3;
  return bVar1;
}

Assistant:

btree_result btree_prev(struct btree_iterator *it, void *key_buf,
                        void *value_buf)
{
    btree_result br = _btree_prev(it, key_buf, value_buf, it->btree.height-1);
    if (br == BTREE_RESULT_SUCCESS) {
        BTREE_ITR_SET_REV(it);
    } else {
        BTREE_ITR_SET_NONE(it);
    }
    return br;
}